

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::IdentifierSelectNameSyntax::getChild(IdentifierSelectNameSyntax *this,size_t index)

{
  Token token;
  long in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  Info *in_stack_ffffffffffffffb0;
  nullptr_t in_stack_ffffffffffffffb8;
  
  if (in_RDX == 0) {
    token.info = in_stack_ffffffffffffffb0;
    token._0_8_ = in_stack_ffffffffffffffa8;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6dec2b,token);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x28),in_stack_ffffffffffffffa8);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffb8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax IdentifierSelectNameSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return identifier;
        case 1: return &selectors;
        default: return nullptr;
    }
}